

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O0

bool __thiscall
cmStringCommand::RegexReplace
          (cmStringCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  cmMakefile *this_00;
  cmMakefile *name;
  bool bVar1;
  const_reference regex_00;
  const_reference pvVar2;
  string *psVar3;
  char *value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  undefined1 local_2c8 [8];
  string output;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_288;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_278;
  undefined1 local_268 [8];
  string input;
  undefined1 local_228 [8];
  string e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  string local_1b0;
  undefined1 local_190 [8];
  cmStringReplaceHelper replaceHelper;
  string *outvar;
  string *replace;
  string *regex;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmStringCommand *this_local;
  
  regex_00 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](args,2);
  pvVar2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](args,3);
  replaceHelper.Makefile =
       (cmMakefile *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::operator[](args,4);
  std::__cxx11::string::string((string *)&local_1b0,(string *)pvVar2);
  cmStringReplaceHelper::cmStringReplaceHelper
            ((cmStringReplaceHelper *)local_190,regex_00,&local_1b0,(this->super_cmCommand).Makefile
            );
  std::__cxx11::string::~string((string *)&local_1b0);
  bVar1 = cmStringReplaceHelper::IsReplaceExpressionValid((cmStringReplaceHelper *)local_190);
  if (bVar1) {
    cmMakefile::ClearMatches((this->super_cmCommand).Makefile);
    bVar1 = cmStringReplaceHelper::IsRegularExpressionValid((cmStringReplaceHelper *)local_190);
    if (bVar1) {
      local_288 = cmMakeRange<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            (args);
      local_278 = cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  ::advance(&local_288,5);
      std::__cxx11::string::string((string *)(output.field_2._M_local_buf + 8));
      cmJoin<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                ((string *)local_268,&local_278,(string *)(output.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(output.field_2._M_local_buf + 8));
      std::__cxx11::string::string((string *)local_2c8);
      this_local._7_1_ =
           cmStringReplaceHelper::Replace
                     ((cmStringReplaceHelper *)local_190,(string *)local_268,(string *)local_2c8);
      name = replaceHelper.Makefile;
      if (this_local._7_1_) {
        this_00 = (this->super_cmCommand).Makefile;
        value = (char *)std::__cxx11::string::c_str();
        cmMakefile::AddDefinition(this_00,(string *)name,value);
      }
      else {
        psVar3 = cmStringReplaceHelper::GetError_abi_cxx11_((cmStringReplaceHelper *)local_190);
        std::operator+(&local_308,"sub-command REGEX, mode REPLACE: ",psVar3);
        std::operator+(&local_2e8,&local_308,".");
        cmCommand::SetError(&this->super_cmCommand,&local_2e8);
        std::__cxx11::string::~string((string *)&local_2e8);
        std::__cxx11::string::~string((string *)&local_308);
      }
      e.field_2._12_4_ = 1;
      std::__cxx11::string::~string((string *)local_2c8);
      std::__cxx11::string::~string((string *)local_268);
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&input.field_2 + 8),
                     "sub-command REGEX, mode REPLACE failed to compile regex \"",regex_00);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_228,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&input.field_2 + 8),"\".");
      std::__cxx11::string::~string((string *)(input.field_2._M_local_buf + 8));
      cmCommand::SetError(&this->super_cmCommand,(string *)local_228);
      this_local._7_1_ = false;
      e.field_2._12_4_ = 1;
      std::__cxx11::string::~string((string *)local_228);
    }
  }
  else {
    psVar3 = cmStringReplaceHelper::GetError_abi_cxx11_((cmStringReplaceHelper *)local_190);
    std::operator+(&local_200,"sub-command REGEX, mode REPLACE: ",psVar3);
    std::operator+(&local_1e0,&local_200,".");
    cmCommand::SetError(&this->super_cmCommand,&local_1e0);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::__cxx11::string::~string((string *)&local_200);
    this_local._7_1_ = false;
    e.field_2._12_4_ = 1;
  }
  cmStringReplaceHelper::~cmStringReplaceHelper((cmStringReplaceHelper *)local_190);
  return this_local._7_1_;
}

Assistant:

bool cmStringCommand::RegexReplace(std::vector<std::string> const& args)
{
  //"STRING(REGEX REPLACE <regular_expression> <replace_expression>
  // <output variable> <input> [<input>...])\n"
  std::string const& regex = args[2];
  std::string const& replace = args[3];
  std::string const& outvar = args[4];
  cmStringReplaceHelper replaceHelper(regex, replace, this->Makefile);

  if (!replaceHelper.IsReplaceExpressionValid()) {
    this->SetError(
      "sub-command REGEX, mode REPLACE: " + replaceHelper.GetError() + ".");
    return false;
  }

  this->Makefile->ClearMatches();

  if (!replaceHelper.IsRegularExpressionValid()) {
    std::string e =
      "sub-command REGEX, mode REPLACE failed to compile regex \"" + regex +
      "\".";
    this->SetError(e);
    return false;
  }

  // Concatenate all the last arguments together.
  const std::string input =
    cmJoin(cmMakeRange(args).advance(5), std::string());
  std::string output;

  if (!replaceHelper.Replace(input, output)) {
    this->SetError(
      "sub-command REGEX, mode REPLACE: " + replaceHelper.GetError() + ".");
    return false;
  }

  // Store the output in the provided variable.
  this->Makefile->AddDefinition(outvar, output.c_str());
  return true;
}